

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed-animatable.cc
# Opt level: O0

bool tinyusdz::tydra::
     EvaluateTypedAnimatableAttribute<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
               (Stage *stage,
               TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>_>
               *tattr,string *attr_name,
               vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
               *value_out,string *err,double t,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  ostream *poVar2;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>_>
  *input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  allocator local_841;
  string local_840 [32];
  fmt local_820 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  string local_7e0;
  allocator local_7b9;
  string local_7b8 [32];
  string local_798;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *local_778;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *pv;
  undefined1 local_768 [7];
  bool ret;
  TerminalAttributeValue value_1;
  Attribute attr;
  string local_268 [32];
  fmt local_248 [36];
  int local_224;
  undefined1 local_220 [8];
  Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>
  value;
  ostringstream local_1c0 [8];
  ostringstream ss_e;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  string *err_local;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *value_out_local;
  string *attr_name_local;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>_>
  *tattr_local;
  Stage *stage_local;
  
  if (value_out ==
      (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar2 = ::std::operator<<((ostream *)local_1c0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed-animatable.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"EvaluateTypedAnimatableAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd4);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1c0,"`value_out` param is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&value._ts._dirty);
      ::std::__cxx11::string::~string((string *)&value._ts._dirty);
    }
    stage_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1c0);
    goto LAB_00883c2a;
  }
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>_>
          ::is_blocked(tattr);
  if (bVar1) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Attribute is Blocked.\n");
    }
    stage_local._7_1_ = 0;
    goto LAB_00883c2a;
  }
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>_>
          ::has_value(tattr);
  if (bVar1) {
    Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>::
    Animatable((Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>
                *)local_220);
    bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>_>
            ::get_value(tattr,(Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>
                               *)local_220);
    if (bVar1) {
      bVar1 = Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>
              ::get((Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>
                     *)local_220,t,value_out,tinterp);
      if (bVar1) {
        stage_local._7_1_ = 1;
        local_224 = 1;
      }
      else {
        if (err != (string *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_268,"Failed to get TypedAnimatableAttribute value: {} \n",
                     (allocator *)
                     ((long)&attr._metas.stringData.
                             super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          fmt::format<std::__cxx11::string>
                    (local_248,(string *)local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name)
          ;
          ::std::__cxx11::string::operator+=((string *)err,(string *)local_248);
          ::std::__cxx11::string::~string((string *)local_248);
          ::std::__cxx11::string::~string(local_268);
          ::std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&attr._metas.stringData.
                             super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        }
        stage_local._7_1_ = 0;
        local_224 = 1;
      }
    }
    else {
      local_224 = 0;
    }
    Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>::
    ~Animatable((Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>
                 *)local_220);
joined_r0x008839b6:
    if (local_224 != 0) goto LAB_00883c2a;
  }
  else {
    bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>_>
            ::has_connections(tattr);
    if (bVar1) {
      (anonymous_namespace)::
      ToAttributeConnection<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                ((Attribute *)
                 &value_1._meta.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(_anonymous_namespace_ *)tattr,
                 input);
      TerminalAttributeValue::TerminalAttributeValue((TerminalAttributeValue *)local_768);
      args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)tinterp;
      pv._7_1_ = EvaluateAttribute(stage,(Attribute *)
                                         &value_1._meta.stringData.
                                          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   attr_name,(TerminalAttributeValue *)local_768,err,t,tinterp);
      if ((bool)pv._7_1_) {
        local_778 = TerminalAttributeValue::
                    as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                              ((TerminalAttributeValue *)local_768);
        if (local_778 ==
            (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)0x0) {
          if (err != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_7b8,
                       "Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}"
                       ,&local_7b9);
            TerminalAttributeValue::type_name_abi_cxx11_
                      (&local_7e0,(TerminalAttributeValue *)local_768);
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
            ::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (&local_798,(fmt *)local_7b8,&local_7e0,&local_800,attr_name,args_2);
            ::std::__cxx11::string::operator+=((string *)err,(string *)&local_798);
            ::std::__cxx11::string::~string((string *)&local_798);
            ::std::__cxx11::string::~string((string *)&local_800);
            ::std::__cxx11::string::~string((string *)&local_7e0);
            ::std::__cxx11::string::~string(local_7b8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
          }
          local_224 = 0;
        }
        else {
          ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
          operator=(value_out,local_778);
          stage_local._7_1_ = 1;
          local_224 = 1;
        }
      }
      else {
        stage_local._7_1_ = 0;
        local_224 = 1;
      }
      TerminalAttributeValue::~TerminalAttributeValue((TerminalAttributeValue *)local_768);
      Attribute::~Attribute
                ((Attribute *)
                 &value_1._meta.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      goto joined_r0x008839b6;
    }
    bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>_>
            ::is_value_empty(tattr);
    if (bVar1) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)err,"Attribute value is empty.\n");
      }
      stage_local._7_1_ = 0;
      goto LAB_00883c2a;
    }
    if (err != (string *)0x0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_840,"[Internal error] Invalid TypedAttribute? : {} \n",&local_841);
      fmt::format<std::__cxx11::string>
                (local_820,(string *)local_840,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name);
      ::std::__cxx11::string::operator+=((string *)err,(string *)local_820);
      ::std::__cxx11::string::~string((string *)local_820);
      ::std::__cxx11::string::~string(local_840);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_841);
    }
  }
  stage_local._7_1_ = 0;
LAB_00883c2a:
  return (bool)(stage_local._7_1_ & 1);
}

Assistant:

bool EvaluateTypedAnimatableAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<Animatable<T>> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err,
    const double t,
    const value::TimeSampleInterpolationType tinterp) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  // Eval order:
  // - ValueBlocked?
  // - has value?(default value or timesamped value)
  // - has connection?

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.has_value()) {
    Animatable<T> value;
    if (tattr.get_value(&value)) {
      if (value.get(t, value_out, tinterp)) {
        return true;
      } else {
        if (err) {
          (*err) += fmt::format("Failed to get TypedAnimatableAttribute value: {} \n", attr_name);
        }
        return false;
      }
    }
  } else if (tattr.has_connections()) {

    // Follow targetPath
    Attribute attr = ToAttributeConnection(tattr);

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 t, tinterp);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}", value.type_name(), value::TypeTraits<T>::type_name(), attr_name);
    }

  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else {
    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}